

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O2

string * __thiscall
Liby::Buffer::retriveveAsString_abi_cxx11_(string *__return_storage_ptr__,Buffer *this,off_t len)

{
  off_t oVar1;
  char *pcVar2;
  
  do {
    if (len < 0) {
      __assert_fail("len >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Buffer.cpp"
                    ,0xf9,"std::string Liby::Buffer::retriveveAsString(off_t)");
    }
    if (len != 0) {
      oVar1 = size(this);
      if (len <= oVar1) {
        pcVar2 = data(this);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,pcVar2,pcVar2 + len);
        retrieve(this,len);
        return __return_storage_ptr__;
      }
    }
    len = size(this);
  } while( true );
}

Assistant:

std::string Buffer::retriveveAsString(off_t len) {
    assert(len >= 0);
    if (len == 0 || len > size())
        return retriveveAsString(size());
    std::string ret(data(), len);
    retrieve(len);
    return ret;
}